

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t
ctrl_set_svc_ref_frame_config(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  long lVar3;
  AV1_PRIMARY *pAVar4;
  long *plVar5;
  long lVar6;
  
  pAVar2 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar5 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar5 + 1;
  }
  lVar3 = *plVar5;
  pAVar4 = pAVar2->ppi;
  (pAVar4->rtc_ref).set_ref_frame_config = 1;
  lVar6 = 0;
  while( true ) {
    uVar1 = *(uint *)(lVar3 + lVar6 * 4);
    if (1 < uVar1) {
      return AOM_CODEC_INVALID_PARAM;
    }
    if (7 < *(uint *)(lVar3 + 0x1c + lVar6 * 4)) break;
    (pAVar4->rtc_ref).reference[lVar6] = uVar1;
    (pAVar4->rtc_ref).ref_idx[lVar6] = *(int *)(lVar3 + 0x1c + lVar6 * 4);
    lVar6 = lVar6 + 1;
    if (lVar6 == 7) {
      lVar6 = 0;
      do {
        uVar1 = *(uint *)(lVar3 + 0x38 + lVar6 * 4);
        if (1 < uVar1) {
          return AOM_CODEC_INVALID_PARAM;
        }
        (pAVar4->rtc_ref).refresh[lVar6] = uVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      (pAVar2->svc).use_flexible_mode = 1;
      (pAVar2->svc).ksvc_fixed_mode = 0;
      return AOM_CODEC_OK;
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_ref_frame_config(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  AV1_COMP *const cpi = ctx->ppi->cpi;
  aom_svc_ref_frame_config_t *const data =
      va_arg(args, aom_svc_ref_frame_config_t *);
  cpi->ppi->rtc_ref.set_ref_frame_config = 1;
  for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    if (data->reference[i] != 0 && data->reference[i] != 1)
      return AOM_CODEC_INVALID_PARAM;
    if (data->ref_idx[i] > 7 || data->ref_idx[i] < 0)
      return AOM_CODEC_INVALID_PARAM;
    cpi->ppi->rtc_ref.reference[i] = data->reference[i];
    cpi->ppi->rtc_ref.ref_idx[i] = data->ref_idx[i];
  }
  for (unsigned int i = 0; i < REF_FRAMES; ++i) {
    if (data->refresh[i] != 0 && data->refresh[i] != 1)
      return AOM_CODEC_INVALID_PARAM;
    cpi->ppi->rtc_ref.refresh[i] = data->refresh[i];
  }
  cpi->svc.use_flexible_mode = 1;
  cpi->svc.ksvc_fixed_mode = 0;
  return AOM_CODEC_OK;
}